

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  long *plVar6;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  size_type *psVar10;
  bool bVar11;
  ulong uVar12;
  uint uVar13;
  Value *this_00;
  ulong value;
  byte *pbVar14;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0 [2];
  long local_e0 [2];
  string local_d0;
  ulong local_b0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  pcVar3 = token->start_;
  if (pcVar3 == token->end_) {
    bVar5 = false;
  }
  else {
    lVar7 = 0;
    bVar11 = false;
    do {
      bVar5 = true;
      if (!bVar11) {
        uVar13 = (byte)pcVar3[lVar7] - 0x2b;
        if (uVar13 < 0x3b) {
          if ((0x400000004000009U >> ((ulong)uVar13 & 0x3f) & 1) == 0) {
            if ((ulong)uVar13 != 2) goto LAB_00546bf1;
            bVar5 = lVar7 != 0;
          }
        }
        else {
LAB_00546bf1:
          bVar5 = false;
        }
      }
      lVar4 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      bVar11 = bVar5;
    } while (pcVar3 + lVar4 != token->end_);
  }
  if (bVar5) {
    bVar5 = decodeDouble(this,token,decoded);
    return bVar5;
  }
  cVar1 = *pcVar3;
  value = 0;
  if (cVar1 == '-') {
    uVar12 = 0x8000000000000000;
  }
  else {
    uVar12 = 0xffffffffffffffff;
  }
  pbVar14 = (byte *)(pcVar3 + (cVar1 == '-'));
  bVar5 = false;
  local_b0 = uVar12 % 10;
  do {
    if (token->end_ <= pbVar14) {
      if (cVar1 == '-') {
        Value::Value(&local_58,-value);
        Value::operator=(decoded,&local_58);
        this_00 = &local_58;
      }
      else if (value < 0x80000000) {
        Value::Value(&local_80,value);
        Value::operator=(decoded,&local_80);
        this_00 = &local_80;
      }
      else {
        Value::Value(&local_a8,value);
        Value::operator=(decoded,&local_a8);
        this_00 = &local_a8;
      }
      Value::~Value(this_00);
      return true;
    }
    bVar2 = *pbVar14;
    pbVar14 = pbVar14 + 1;
    if ((byte)(bVar2 - 0x3a) < 0xf6) {
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x5982dd);
      local_110 = &local_100;
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_100 = *plVar8;
        lStack_f8 = plVar6[3];
      }
      else {
        local_100 = *plVar8;
        local_110 = (long *)*plVar6;
      }
      local_108 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
      psVar10 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_d0.field_2._M_allocated_capacity = *psVar10;
        local_d0.field_2._8_8_ = plVar6[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar10;
        local_d0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_d0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      addError(this,&local_d0,token,(Location)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0],local_e0[0] + 1);
      }
      bVar11 = false;
      bVar5 = false;
    }
    else {
      uVar9 = (ulong)(bVar2 - 0x30);
      if ((value < uVar12 / 10) ||
         (((value <= uVar12 / 10 && (pbVar14 == (byte *)token->end_)) && (uVar9 <= local_b0)))) {
        value = uVar9 + value * 10;
        bVar11 = true;
      }
      else {
        bVar5 = decodeDouble(this,token,decoded);
        bVar11 = false;
      }
    }
  } while (bVar11);
  return bVar5;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  bool isDouble = false;
  for (Location inspect = token.start_; inspect != token.end_; ++inspect) {
    isDouble = isDouble || in(*inspect, '.', 'e', 'E', '+') ||
               (*inspect == '-' && inspect != token.start_);
  }
  if (isDouble)
    return decodeDouble(token, decoded);
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return addError("'" + std::string(token.start_, token.end_) +
                          "' is not a number.",
                      token);
    Value::UInt digit(c - '0');
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}